

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O3

Error * __thiscall
libsbox::Task::
deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Error *__return_storage_ptr__,Task *this,Value *value)

{
  ushort uVar1;
  undefined8 uVar2;
  bool bVar3;
  Number NVar4;
  Type pGVar5;
  Data local_40;
  long local_30 [2];
  
  if ((value->data_).f.flags == 3) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_40.s,(Ch *)value);
    uVar2 = local_40.n;
    NVar4.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(value);
    if (uVar2 == NVar4.i64) {
      local_40.n = (Number)local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Response JSON is incorrect","");
      Error::Error(__return_storage_ptr__,(string *)&local_40.s);
    }
    else {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"time_usage_ms");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000)
          == (undefined1  [16])0x0) {
        local_40.n = (Number)local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Response JSON is incorrect","");
        Error::Error(__return_storage_ptr__,(string *)&local_40.s);
      }
      else {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)value,"time_usage_ms");
        if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000)
            == (undefined1  [16])0x0) {
LAB_0010c463:
          __assert_fail("data_.f.flags & kInt64Flag",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                        ,0x71b,
                        "int64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        this->time_usage_ms_ = (time_ms_t)(pGVar5->data_).n;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,(Ch *)value);
        uVar2 = local_40.n;
        NVar4.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(value);
        if (uVar2 == NVar4.i64) {
          local_40.n = (Number)local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Response JSON is incorrect","");
          Error::Error(__return_storage_ptr__,(string *)&local_40.s);
        }
        else {
          pGVar5 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"time_usage_sys_ms");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
              (undefined1  [16])0x0) {
            local_40.n = (Number)local_30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"Response JSON is incorrect","");
            Error::Error(__return_storage_ptr__,(string *)&local_40.s);
          }
          else {
            pGVar5 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)value,"time_usage_sys_ms");
            if ((undefined1  [16])
                ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                (undefined1  [16])0x0) goto LAB_0010c463;
            this->time_usage_sys_ms_ = (time_ms_t)(pGVar5->data_).n;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_40.s,(Ch *)value);
            NVar4.i = (I)rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::MemberEnd(value);
            if (local_40.n.i64 == (Number)NVar4.i64) {
              local_40.n = (Number)local_30;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_40,"Response JSON is incorrect","");
              Error::Error(__return_storage_ptr__,(string *)&local_40.s);
            }
            else {
              pGVar5 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)value,"time_usage_user_ms");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                  (undefined1  [16])0x0) {
                local_40.n = (Number)local_30;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_40,"Response JSON is incorrect","");
                Error::Error(__return_storage_ptr__,(string *)&local_40.s);
              }
              else {
                pGVar5 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)value,"time_usage_user_ms");
                if ((undefined1  [16])
                    ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                    (undefined1  [16])0x0) goto LAB_0010c463;
                this->time_usage_user_ms_ = (time_ms_t)(pGVar5->data_).n;
                bVar3 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::HasMember(value,"wall_time_usage_ms");
                if (bVar3) {
                  pGVar5 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"wall_time_usage_ms");
                  if ((undefined1  [16])
                      ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                      (undefined1  [16])0x0) {
                    local_40.n = (Number)local_30;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_40,"Response JSON is incorrect","");
                    Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                  }
                  else {
                    pGVar5 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>
                                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         *)value,"wall_time_usage_ms");
                    if ((undefined1  [16])
                        ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                        (undefined1  [16])0x0) goto LAB_0010c463;
                    this->wall_time_usage_ms_ = (time_ms_t)(pGVar5->data_).n;
                    bVar3 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::HasMember(value,"memory_usage_kb");
                    if (bVar3) {
                      pGVar5 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)value,"memory_usage_kb");
                      if ((undefined1  [16])
                          ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000) ==
                          (undefined1  [16])0x0) {
                        local_40.n = (Number)local_30;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_40,"Response JSON is incorrect","");
                        Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                      }
                      else {
                        pGVar5 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>
                                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             *)value,"memory_usage_kb");
                        if ((undefined1  [16])
                            ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x80000000000000)
                            == (undefined1  [16])0x0) goto LAB_0010c463;
                        this->memory_usage_kb_ = (memory_kb_t)(pGVar5->data_).n;
                        bVar3 = rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::HasMember(value,"time_limit_exceeded");
                        if (bVar3) {
                          pGVar5 = rapidjson::
                                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   ::operator[]<char_const>
                                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               *)value,"time_limit_exceeded");
                          if ((undefined1  [16])
                              ((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x8000000000000)
                              == (undefined1  [16])0x0) {
                            local_40.n = (Number)local_30;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_40,"Response JSON is incorrect","");
                            Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                          }
                          else {
                            pGVar5 = rapidjson::
                                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     ::operator[]<char_const>
                                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 *)value,"time_limit_exceeded");
                            uVar1 = (pGVar5->data_).f.flags;
                            if ((uVar1 & 8) == 0) goto LAB_0010c5a8;
                            this->time_limit_exceeded_ = uVar1 == 10;
                            bVar3 = rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::HasMember(value,"wall_time_limit_exceeded");
                            if (bVar3) {
                              pGVar5 = rapidjson::
                                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       ::operator[]<char_const>
                                                 ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"wall_time_limit_exceeded");
                              if ((undefined1  [16])
                                  ((undefined1  [16])pGVar5->data_ &
                                  (undefined1  [16])0x8000000000000) == (undefined1  [16])0x0) {
                                local_40.n = (Number)local_30;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_40,"Response JSON is incorrect","");
                                Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                              }
                              else {
                                pGVar5 = rapidjson::
                                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         ::operator[]<char_const>
                                                   ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"wall_time_limit_exceeded");
                                uVar1 = (pGVar5->data_).f.flags;
                                if ((uVar1 & 8) == 0) goto LAB_0010c5a8;
                                this->wall_time_limit_exceeded_ = uVar1 == 10;
                                bVar3 = rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        ::HasMember(value,"exited");
                                if (bVar3) {
                                  pGVar5 = rapidjson::
                                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           ::operator[]<char_const>
                                                     ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exited");
                                  if ((undefined1  [16])
                                      ((undefined1  [16])pGVar5->data_ &
                                      (undefined1  [16])0x8000000000000) == (undefined1  [16])0x0) {
                                    local_40.n = (Number)local_30;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_40,"Response JSON is incorrect","");
                                    Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                                  }
                                  else {
                                    pGVar5 = rapidjson::
                                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             ::operator[]<char_const>
                                                       ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exited");
                                    uVar1 = (pGVar5->data_).f.flags;
                                    if ((uVar1 & 8) == 0) goto LAB_0010c5a8;
                                    this->exited_ = uVar1 == 10;
                                    bVar3 = rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            ::HasMember(value,"exit_code");
                                    if (bVar3) {
                                      pGVar5 = rapidjson::
                                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               ::operator[]<char_const>
                                                         ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exit_code");
                                      if ((undefined1  [16])
                                          ((undefined1  [16])pGVar5->data_ &
                                          (undefined1  [16])0x20000000000000) ==
                                          (undefined1  [16])0x0) {
                                        local_40.n = (Number)local_30;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_40,"Response JSON is incorrect",
                                                   "");
                                        Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                                      }
                                      else {
                                        pGVar5 = rapidjson::
                                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 ::operator[]<char_const>
                                                           ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exit_code");
                                        if ((undefined1  [16])
                                            ((undefined1  [16])pGVar5->data_ &
                                            (undefined1  [16])0x20000000000000) ==
                                            (undefined1  [16])0x0) {
LAB_0010c5c7:
                                          __assert_fail("data_.f.flags & kIntFlag",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                                                  ,0x719,
                                                  "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                                                  );
                                        }
                                        this->exit_code_ = (pGVar5->data_).s.length;
                                        bVar3 = rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                ::HasMember(value,"signaled");
                                        if (bVar3) {
                                          pGVar5 = rapidjson::
                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"signaled");
                                          if ((undefined1  [16])
                                              ((undefined1  [16])pGVar5->data_ &
                                              (undefined1  [16])0x8000000000000) ==
                                              (undefined1  [16])0x0) {
                                            local_40.n = (Number)local_30;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_40,
                                                       "Response JSON is incorrect","");
                                            Error::Error(__return_storage_ptr__,
                                                         (string *)&local_40.s);
                                          }
                                          else {
                                            pGVar5 = rapidjson::
                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"signaled");
                                            uVar1 = (pGVar5->data_).f.flags;
                                            if ((uVar1 & 8) == 0) goto LAB_0010c5a8;
                                            this->signaled_ = uVar1 == 10;
                                            bVar3 = rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"term_signal");
                                            if (bVar3) {
                                              pGVar5 = rapidjson::
                                                                                                              
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"term_signal");
                                              if ((undefined1  [16])
                                                  ((undefined1  [16])pGVar5->data_ &
                                                  (undefined1  [16])0x20000000000000) ==
                                                  (undefined1  [16])0x0) {
                                                local_40.n = (Number)local_30;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)&local_40,
                                                           "Response JSON is incorrect","");
                                                Error::Error(__return_storage_ptr__,
                                                             (string *)&local_40.s);
                                              }
                                              else {
                                                pGVar5 = rapidjson::
                                                                                                                  
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"term_signal");
                                                if ((undefined1  [16])
                                                    ((undefined1  [16])pGVar5->data_ &
                                                    (undefined1  [16])0x20000000000000) ==
                                                    (undefined1  [16])0x0) goto LAB_0010c5c7;
                                                this->term_signal_ = (pGVar5->data_).s.length;
                                                bVar3 = rapidjson::
                                                                                                                
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"oom_killed");
                                                if (bVar3) {
                                                  pGVar5 = rapidjson::
                                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"oom_killed");
                                                  if ((undefined1  [16])
                                                      ((undefined1  [16])pGVar5->data_ &
                                                      (undefined1  [16])0x8000000000000) ==
                                                      (undefined1  [16])0x0) {
                                                    local_40.n = (Number)local_30;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_40,
                                                               "Response JSON is incorrect","");
                                                    Error::Error(__return_storage_ptr__,
                                                                 (string *)&local_40.s);
                                                  }
                                                  else {
                                                    pGVar5 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"oom_killed");
                                                  uVar1 = (pGVar5->data_).f.flags;
                                                  if ((uVar1 & 8) == 0) {
LAB_0010c5a8:
                                                    __assert_fail("IsBool()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                                                  ,0x498,
                                                  "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                                                  );
                                                  }
                                                  this->oom_killed_ = uVar1 == 10;
                                                  bVar3 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"memory_limit_hit");
                                                  if (bVar3) {
                                                    pGVar5 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"memory_limit_hit");
                                                  if ((undefined1  [16])
                                                      ((undefined1  [16])pGVar5->data_ &
                                                      (undefined1  [16])0x8000000000000) !=
                                                      (undefined1  [16])0x0) {
                                                    pGVar5 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"memory_limit_hit");
                                                  uVar1 = (pGVar5->data_).f.flags;
                                                  if ((uVar1 & 8) != 0) {
                                                    this->memory_limit_hit_ = uVar1 == 10;
                                                    (__return_storage_ptr__->error_).field_2.
                                                    _M_allocated_capacity = 0;
                                                    *(undefined8 *)
                                                     ((long)&(__return_storage_ptr__->error_).
                                                             field_2 + 8) = 0;
                                                    (__return_storage_ptr__->error_)._M_dataplus.
                                                    _M_p = (pointer)&(__return_storage_ptr__->error_
                                                                     ).field_2;
                                                    (__return_storage_ptr__->error_).
                                                    _M_string_length = 0;
                                                    return __return_storage_ptr__;
                                                  }
                                                  goto LAB_0010c5a8;
                                                  }
                                                  local_40.n = (Number)local_30;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_40,
                                                             "Response JSON is incorrect","");
                                                  Error::Error(__return_storage_ptr__,
                                                               (string *)&local_40.s);
                                                  }
                                                  else {
                                                    local_40.n = (Number)local_30;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_40,
                                                               "Response JSON is incorrect","");
                                                    Error::Error(__return_storage_ptr__,
                                                                 (string *)&local_40.s);
                                                  }
                                                  }
                                                }
                                                else {
                                                  local_40.n = (Number)local_30;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_40,
                                                             "Response JSON is incorrect","");
                                                  Error::Error(__return_storage_ptr__,
                                                               (string *)&local_40.s);
                                                }
                                              }
                                            }
                                            else {
                                              local_40.n = (Number)local_30;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_40,
                                                         "Response JSON is incorrect","");
                                              Error::Error(__return_storage_ptr__,
                                                           (string *)&local_40.s);
                                            }
                                          }
                                        }
                                        else {
                                          local_40.n = (Number)local_30;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_40,
                                                     "Response JSON is incorrect","");
                                          Error::Error(__return_storage_ptr__,(string *)&local_40.s)
                                          ;
                                        }
                                      }
                                    }
                                    else {
                                      local_40.n = (Number)local_30;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_40,"Response JSON is incorrect",""
                                                );
                                      Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                                    }
                                  }
                                }
                                else {
                                  local_40.n = (Number)local_30;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_40,"Response JSON is incorrect","");
                                  Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                                }
                              }
                            }
                            else {
                              local_40.n = (Number)local_30;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_40,"Response JSON is incorrect","");
                              Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                            }
                          }
                        }
                        else {
                          local_40.n = (Number)local_30;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_40,"Response JSON is incorrect","");
                          Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                        }
                      }
                    }
                    else {
                      local_40.n = (Number)local_30;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_40,"Response JSON is incorrect","");
                      Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                    }
                  }
                }
                else {
                  local_40.n = (Number)local_30;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_40,"Response JSON is incorrect","");
                  Error::Error(__return_storage_ptr__,(string *)&local_40.s);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_40.n = (Number)local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Response JSON is incorrect","");
    Error::Error(__return_storage_ptr__,(string *)&local_40.s);
  }
  if (local_40.n.i64 != (Number)local_30) {
    operator_delete((void *)local_40.n,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Task::deserialize_response(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_usage_ms_, value, "time_usage_ms", Int64);
    GET_MEMBER(time_usage_sys_ms_, value, "time_usage_sys_ms", Int64);
    GET_MEMBER(time_usage_user_ms_, value, "time_usage_user_ms", Int64);
    GET_MEMBER(wall_time_usage_ms_, value, "wall_time_usage_ms", Int64);
    GET_MEMBER(memory_usage_kb_, value, "memory_usage_kb", Int64);
    GET_MEMBER(time_limit_exceeded_, value, "time_limit_exceeded", Bool);
    GET_MEMBER(wall_time_limit_exceeded_, value, "wall_time_limit_exceeded", Bool);
    GET_MEMBER(exited_, value, "exited", Bool);
    GET_MEMBER(exit_code_, value, "exit_code", Int);
    GET_MEMBER(signaled_, value, "signaled", Bool);
    GET_MEMBER(term_signal_, value, "term_signal", Int);
    GET_MEMBER(oom_killed_, value, "oom_killed", Bool);
    GET_MEMBER(memory_limit_hit_, value, "memory_limit_hit", Bool);
    return Error();
}